

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Widget_Type.cxx
# Opt level: O0

void textsize_cb(Fl_Value_Input *i,void *v)

{
  int iVar1;
  double dVar2;
  Fl_Widget_Type *q;
  Fl_Type *o;
  int mod;
  Fl_Color c;
  int s;
  Fl_Font n;
  void *v_local;
  Fl_Value_Input *i_local;
  
  _s = v;
  v_local = i;
  if ((char *)v == "LOAD") {
    iVar1 = (*(current_widget->super_Fl_Type)._vptr_Fl_Type[0x2b])
                      (current_widget,0,&c,&mod,(long)&o + 4);
    if (iVar1 == 0) {
      Fl_Widget::deactivate((Fl_Widget *)v_local);
      return;
    }
    Fl_Widget::activate((Fl_Widget *)v_local);
  }
  else {
    o._0_4_ = 0;
    dVar2 = Fl_Valuator::value(&i->super_Fl_Valuator);
    mod = (int)dVar2;
    if (mod < 1) {
      mod = Fl_Widget_Type::default_size;
    }
    for (q = (Fl_Widget_Type *)Fl_Type::first; q != (Fl_Widget_Type *)0x0;
        q = (Fl_Widget_Type *)(q->super_Fl_Type).next) {
      if (((q->super_Fl_Type).selected != '\0') &&
         (iVar1 = (*(q->super_Fl_Type)._vptr_Fl_Type[0x17])(), iVar1 != 0)) {
        (*(q->super_Fl_Type)._vptr_Fl_Type[0x2b])(q,2,&c,&mod,(long)&o + 4);
        Fl_Widget::redraw(q->o);
        o._0_4_ = 1;
      }
    }
    if ((int)o != 0) {
      set_modflag(1);
    }
  }
  Fl_Valuator::value((Fl_Valuator *)v_local,(double)mod);
  return;
}

Assistant:

void textsize_cb(Fl_Value_Input* i, void* v) {
  Fl_Font n; int s; Fl_Color c;
  if (v == LOAD) {
    if (!current_widget->textstuff(0,n,s,c)) {i->deactivate(); return;}
    i->activate();
  } else {
    int mod = 0;
    s = int(i->value());
    if (s <= 0) s = Fl_Widget_Type::default_size;
    for (Fl_Type *o = Fl_Type::first; o; o = o->next) {
      if (o->selected && o->is_widget()) {
	Fl_Widget_Type* q = (Fl_Widget_Type*)o;
	q->textstuff(2,n,s,c);
	q->o->redraw();
	mod = 1;
      }
    }
    if (mod) set_modflag(1);
  }
  i->value(s);
}